

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printHelp(Output *output,bool extended)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined7 in_register_00000031;
  char *pcVar1;
  
  (*output->_vptr_Output[3])
            (output,
             "qgrep %s (http://github.com/zeux/qgrep)\n\nBasic commands:\n  qgrep init <project> <path>\n  qgrep update <project-list>\n  qgrep search <project-list> <search-options> <query>\n  qgrep watch <project-list>\n  qgrep interactive <project-list>\n  qgrep help\n"
             ,kVersion);
  UNRECOVERED_JUMPTABLE = output->_vptr_Output[3];
  if ((int)CONCAT71(in_register_00000031,extended) == 0) {
    pcVar1 = 
    "\n<project> is a project name (stored in ~/.qgrep) or a path to .cfg file\n<project-list> is * or % (all projects) or a comma-separated list of names\n<query> is a regular expression\n\n<search-options> can include:\n  i - case-insensitive search          l - literal (substring) search\n  V - Visual Studio formatting         S - print search summary\n"
    ;
  }
  else {
    (*UNRECOVERED_JUMPTABLE)
              (output,
               "\nAdvanced commands:\n  qgrep build <project-list>\n  qgrep change <project-list> <file-list>\n  qgrep files <project-list>\n  qgrep files <project-list> <search-options> <query>\n  qgrep filter <search-options> <query>\n  qgrep info <project-list>\n  qgrep projects\n"
              );
    (*output->_vptr_Output[3])
              (output,
               "\n<project> is a project name (stored in ~/.qgrep) or a path to .cfg file\n<project-list> is * or % (all projects) or a comma-separated list of names\n<query> is a regular expression\n\n<search-options> can include:\n  i - case-insensitive search          l - literal (substring) search\n  V - Visual Studio formatting         S - print search summary\n"
              );
    UNRECOVERED_JUMPTABLE = output->_vptr_Output[3];
    pcVar1 = 
    "  C - output match column number       CE - output match starting and ending column numbers\n  L<num> - limit output to <num> lines\n\n<search-options> can include flags for restricting searches to certain files:\n  fi<re> - only search in files with paths matching regex <re>\n  fe<re> - don\'t search in files with paths matching regex <re>\n\n<search-options> can include additional options for output highlighting:\n  H - force enable highlighting        HD - force disable highlighting\n      (default for TTY output)         HM - only highlight search matches\n\n<search-options> can include additional options for files/filter commands:\n  fp - search in file paths (default)  fn - search in file names\n  ff - fuzzy search with ranking       fs - search for space-delimited words\n\nin interactive mode, you can input \'search\' and \'files\' commands without a project list.\n"
    ;
  }
  (*UNRECOVERED_JUMPTABLE)(output,pcVar1);
  return;
}

Assistant:

void printHelp(Output* output, bool extended)
{
	output->print(
"qgrep %s (http://github.com/zeux/qgrep)\n"
"\n"
"Basic commands:\n"
"  qgrep init <project> <path>\n"
"  qgrep update <project-list>\n"
"  qgrep search <project-list> <search-options> <query>\n"
"  qgrep watch <project-list>\n"
"  qgrep interactive <project-list>\n"
"  qgrep help\n", kVersion);

    if (extended)
        output->print(
"\n"
"Advanced commands:\n"
"  qgrep build <project-list>\n"
"  qgrep change <project-list> <file-list>\n"
"  qgrep files <project-list>\n"
"  qgrep files <project-list> <search-options> <query>\n"
"  qgrep filter <search-options> <query>\n"
"  qgrep info <project-list>\n"
"  qgrep projects\n");

    output->print(
"\n"
"<project> is a project name (stored in ~/.qgrep) or a path to .cfg file\n"
"<project-list> is * or % (all projects) or a comma-separated list of names\n"
"<query> is a regular expression\n"
"\n"
"<search-options> can include:\n"
"  i - case-insensitive search          l - literal (substring) search\n"
"  V - Visual Studio formatting         S - print search summary\n");

    if (extended)
        output->print(
"  C - output match column number       CE - output match starting and ending column numbers\n"
"  L<num> - limit output to <num> lines\n"
"\n"
"<search-options> can include flags for restricting searches to certain files:\n"
"  fi<re> - only search in files with paths matching regex <re>\n"
"  fe<re> - don't search in files with paths matching regex <re>\n"
"\n"
"<search-options> can include additional options for output highlighting:\n"
"  H - force enable highlighting        HD - force disable highlighting\n"
"      (default for TTY output)         HM - only highlight search matches\n"  
"\n"
"<search-options> can include additional options for files/filter commands:\n"
"  fp - search in file paths (default)  fn - search in file names\n"
"  ff - fuzzy search with ranking       fs - search for space-delimited words\n"
"\n"
"in interactive mode, you can input 'search' and 'files' commands without a project list.\n");
}